

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_top_n.cpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalTopN *op)

{
  vector<duckdb::BoundOrderByNode,_true> *args_1;
  vector<duckdb::LogicalType,_true> *args;
  unsigned_long *args_5;
  PhysicalOperator *__uref;
  PhysicalOperator *pPVar1;
  long in_RSI;
  unsigned_long *in_RDI;
  LogicalOperator *in_stack_00000030;
  PhysicalPlanGenerator *in_stack_00000038;
  PhysicalOperator *top_n;
  PhysicalOperator *plan;
  size_type in_stack_ffffffffffffff98;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *in_stack_ffffffffffffffa0;
  PhysicalPlanGenerator *in_stack_ffffffffffffffc0;
  
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator*
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_ffffffffffffffa0);
  CreatePlan(in_stack_00000038,in_stack_00000030);
  args_1 = (vector<duckdb::BoundOrderByNode,_true> *)(in_RSI + 0x40);
  args = (vector<duckdb::LogicalType,_true> *)(in_RSI + 0x68);
  NumericCast<unsigned_long,unsigned_long,void>(0x74b381);
  args_5 = (unsigned_long *)NumericCast<unsigned_long,unsigned_long,void>(0x74b397);
  __uref = (PhysicalOperator *)(in_RSI + 0x58);
  pPVar1 = Make<duckdb::PhysicalTopN,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,unsigned_long,duckdb::shared_ptr<duckdb::DynamicFilterData,true>,unsigned_long&>
                     (in_stack_ffffffffffffffc0,args,args_1,in_RDI,
                      (unsigned_long *)in_stack_ffffffffffffffa0,
                      (shared_ptr<duckdb::DynamicFilterData,_true> *)__uref,args_5);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)in_stack_ffffffffffffffa0,__uref);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(in_stack_ffffffffffffffa0,(value_type *)__uref);
  return pPVar1;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalTopN &op) {
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);
	auto &top_n =
	    Make<PhysicalTopN>(op.types, std::move(op.orders), NumericCast<idx_t>(op.limit), NumericCast<idx_t>(op.offset),
	                       std::move(op.dynamic_filter), op.estimated_cardinality);
	top_n.children.push_back(plan);
	return top_n;
}